

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.h
# Opt level: O0

void w256_to_bitstream(bitstream_t *bs,word256 v,size_t width,size_t size)

{
  ulong in_RDX;
  long in_RSI;
  bitstream_t *in_RDI;
  size_t bits;
  uint64_t *d;
  uint64_t buf [4];
  ulong local_f0;
  uint64_t *local_e8;
  uint64_t local_e0 [15];
  bitstream_t *local_68;
  uint64_t *local_38;
  
  local_38 = local_e0;
  local_e8 = local_e0 + in_RSI + -1;
  local_68 = in_RDI;
  for (local_f0 = in_RDX; 0x3f < local_f0; local_f0 = local_f0 - 0x40) {
    bitstream_put_bits(local_68,*local_e8,0x40);
    local_e8 = local_e8 + -1;
  }
  if (local_f0 != 0) {
    bitstream_put_bits(local_68,*local_e8 >> (0x40U - (char)local_f0 & 0x3f),(uint)local_f0);
  }
  return;
}

Assistant:

ATTR_TARGET_S256
static inline void w256_to_bitstream(bitstream_t* bs, const word256 v, const size_t width,
                                     const size_t size) {
  ATTR_ALIGNED(32) uint64_t buf[4];
  mm256_store(buf, v);

  const uint64_t* d = &buf[width - 1];
  size_t bits       = size;
  for (; bits >= sizeof(uint64_t) * 8; bits -= sizeof(uint64_t) * 8, --d) {
    bitstream_put_bits(bs, *d, sizeof(uint64_t) * 8);
  }
  if (bits) {
    bitstream_put_bits(bs, *d >> (sizeof(uint64_t) * 8 - bits), bits);
  }
}